

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_31::constant_propagation_tests(void)

{
  bool bVar1;
  iterator __first;
  Program *prog_00;
  Program *prog_01;
  string local_1b8;
  Program local_198;
  token *local_138;
  __normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
  local_130;
  allocator<char> local_121;
  string local_120 [32];
  vector<skiwi::token,_std::allocator<skiwi::token>_> local_100;
  string local_e8;
  undefined1 local_c8 [8];
  Program prog;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"(let ((x 5)) (let ((y x)) (+ y y)))",&local_41);
  skiwi::tokenize((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  __first = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                      ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  prog._88_8_ = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            ((__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )__first._M_current,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )prog._88_8_);
  skiwi::make_program((vector *)local_c8);
  skiwi::constant_propagation((Program *)local_c8);
  (anonymous_namespace)::to_string_abi_cxx11_(&local_e8,(_anonymous_namespace_ *)local_c8,prog_00);
  bVar1 = std::operator==(&local_e8,"( + 5 5 ) ");
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
                    ,0x110,"void skiwi::(anonymous namespace)::constant_propagation_tests()");
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"(if (and #f (f 2)) 123 (g 3))",&local_121);
  skiwi::tokenize((string *)&local_100);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::operator=
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20,&local_100);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  local_130._M_current =
       (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  local_138 = (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                                 ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_130,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )local_138);
  skiwi::make_program((vector *)&local_198);
  Program::operator=((Program *)local_c8,&local_198);
  Program::~Program(&local_198);
  skiwi::simplify_to_core_forms((Program *)local_c8);
  skiwi::constant_folding((Program *)local_c8);
  (anonymous_namespace)::to_string_abi_cxx11_(&local_1b8,(_anonymous_namespace_ *)local_c8,prog_01);
  bVar1 = std::operator==(&local_1b8,"( g 3 ) ");
  TestEq<bool,bool>(true,bVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
                    ,0x117,"void skiwi::(anonymous namespace)::constant_propagation_tests()");
  std::__cxx11::string::~string((string *)&local_1b8);
  Program::~Program((Program *)local_c8);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  return;
}

Assistant:

void constant_propagation_tests()
    {
    auto tokens = tokenize("(let ((x 5)) (let ((y x)) (+ y y)))");
    std::reverse(tokens.begin(), tokens.end());
    auto prog = make_program(tokens);
    constant_propagation(prog);
    TEST_ASSERT(to_string(prog) == "( + 5 5 ) ");

    tokens = tokenize("(if (and #f (f 2)) 123 (g 3))");
    std::reverse(tokens.begin(), tokens.end());
    prog = make_program(tokens);
    simplify_to_core_forms(prog);
    constant_folding(prog);
    TEST_ASSERT(to_string(prog) == "( g 3 ) ");
    }